

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::AddErrorOrWarning
          (ErrorPrinter *this,string *filename,int line,int column,string *message,string *type,
          ostream *out)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  string *psVar4;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  if ((this->format_ == ERROR_FORMAT_MSVS) && (this->tree_ != (DiskSourceTree *)0x0)) {
    bVar1 = DiskSourceTree::VirtualFileToDiskFile(this->tree_,filename,&local_50);
    psVar4 = &local_50;
    if (!bVar1) goto LAB_0020ac52;
  }
  else {
LAB_0020ac52:
    psVar4 = filename;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,(psVar4->_M_dataplus)._M_p,psVar4->_M_string_length);
  if (line != -1) {
    if (this->format_ == ERROR_FORMAT_MSVS) {
      std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,line + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,") : ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,(type->_M_dataplus)._M_p,type->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," in column=",0xb);
    }
    else {
      if (this->format_ != ERROR_FORMAT_GCC) goto LAB_0020ad2c;
      std::__ostream_insert<char,std::char_traits<char>>(out,":",1);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)out,line + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,":",1);
    }
    std::ostream::operator<<((ostream *)poVar3,column + 1);
  }
LAB_0020ad2c:
  iVar2 = std::__cxx11::string::compare((char *)type);
  if (iVar2 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,": warning: ",0xb);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(out,": ",2);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (out,(message->_M_dataplus)._M_p,message->_M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  }
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void AddErrorOrWarning(const string& filename, int line, int column,
                         const string& message, const string& type,
                         std::ostream& out) {
    // Print full path when running under MSVS
    string dfile;
    if (format_ == CommandLineInterface::ERROR_FORMAT_MSVS &&
        tree_ != NULL &&
        tree_->VirtualFileToDiskFile(filename, &dfile)) {
      out << dfile;
    } else {
      out << filename;
    }

    // Users typically expect 1-based line/column numbers, so we add 1
    // to each here.
    if (line != -1) {
      // Allow for both GCC- and Visual-Studio-compatible output.
      switch (format_) {
        case CommandLineInterface::ERROR_FORMAT_GCC:
          out << ":" << (line + 1) << ":" << (column + 1);
          break;
        case CommandLineInterface::ERROR_FORMAT_MSVS:
          out << "(" << (line + 1) << ") : "
              << type << " in column=" << (column + 1);
          break;
      }
    }

    if (type == "warning") {
      out << ": warning: " << message << std::endl;
    } else {
      out << ": " << message << std::endl;
    }
  }